

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

int SSL_set1_verify_cert_store(SSL *ssl,X509_STORE *store)

{
  bool bVar1;
  pointer pSVar2;
  pointer pCVar3;
  X509_STORE *store_local;
  SSL *ssl_local;
  
  bssl::check_ssl_x509_method(ssl);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    pCVar3 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&pSVar2->cert);
    ssl_local._4_4_ = set_cert_store(&pCVar3->verify_store,store,1);
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set1_verify_cert_store(SSL *ssl, X509_STORE *store) {
  check_ssl_x509_method(ssl);
  if (!ssl->config) {
    return 0;
  }
  return set_cert_store(&ssl->config->cert->verify_store, store, 1);
}